

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Lookup
          (PersistentStorageJson *this,Network *aValue,
          vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          *aRet)

{
  _Invoker_type aRet_00;
  Status SVar1;
  string local_a0;
  function<bool_(const_ot::commissioner::persistent_storage::Network_&)> local_70;
  anon_class_8_1_4b93a6ce local_50;
  anon_class_1_0_00000001 local_41;
  undefined1 local_40 [8];
  function<bool_(const_ot::commissioner::persistent_storage::Network_&)> pred;
  vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
  *aRet_local;
  Network *aValue_local;
  PersistentStorageJson *this_local;
  
  pred._M_invoker = (_Invoker_type)aRet;
  std::function<bool(ot::commissioner::persistent_storage::Network_const&)>::
  function<ot::commissioner::persistent_storage::PersistentStorageJson::Lookup(ot::commissioner::persistent_storage::Network_const&,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>&)::__0,void>
            ((function<bool(ot::commissioner::persistent_storage::Network_const&)> *)local_40,
             &local_41);
  local_50.aValue = aValue;
  std::function<bool(ot::commissioner::persistent_storage::Network_const&)>::operator=
            ((function<bool(ot::commissioner::persistent_storage::Network_const&)> *)local_40,
             &local_50);
  std::function<bool_(const_ot::commissioner::persistent_storage::Network_&)>::function
            (&local_70,
             (function<bool_(const_ot::commissioner::persistent_storage::Network_&)> *)local_40);
  aRet_00 = pred._M_invoker;
  std::__cxx11::string::string((string *)&local_a0,(string *)JSON_NWK_abi_cxx11_);
  SVar1 = LookupPred<ot::commissioner::persistent_storage::Network>
                    (this,&local_70,
                     (vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                      *)aRet_00,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::function<bool_(const_ot::commissioner::persistent_storage::Network_&)>::~function(&local_70);
  std::function<bool_(const_ot::commissioner::persistent_storage::Network_&)>::~function
            ((function<bool_(const_ot::commissioner::persistent_storage::Network_&)> *)local_40);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Lookup(Network const &aValue, std::vector<Network> &aRet)
{
    std::function<bool(Network const &)> pred = [](Network const &) { return true; };

    pred = [&aValue](Network const &el) {
        bool aRet = (aValue.mCcm < 0 || aValue.mCcm == el.mCcm) &&
                    (aValue.mId.mId == EMPTY_ID || (el.mId.mId == aValue.mId.mId)) &&
                    (aValue.mDomainId.mId == EMPTY_ID || (el.mDomainId.mId == aValue.mDomainId.mId)) &&
                    (aValue.mName.empty() || (aValue.mName == el.mName)) &&
                    (aValue.mXpan == 0 || aValue.mXpan == el.mXpan) && (aValue.mPan == 0 || (aValue.mPan == el.mPan)) &&
                    (aValue.mMlp.empty() || CaseInsensitiveEqual(aValue.mMlp, el.mMlp)) &&
                    (aValue.mChannel == 0 || (aValue.mChannel == el.mChannel));

        return aRet;
    };

    return LookupPred<Network>(pred, aRet, JSON_NWK);
}